

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::enterInitializingModeIterative(Federate *this)

{
  Modes MVar1;
  int iVar2;
  element_type *peVar3;
  PotentialInterfacesManager *this_00;
  InvalidFunctionCall *this_01;
  string_view message;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cmd;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  MVar1 = (this->currentMode)._M_i;
  if (MVar1 == PENDING_ITERATIVE_INIT) {
    enterInitializingModeIterativeComplete(this);
    return;
  }
  if (MVar1 != STARTUP) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "cannot call iterative initialization from current state";
    message._M_len = 0x37;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message);
    __cxa_throw(this_01,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  if ((this->hasPotentialInterfaces == true) &&
     ((this->potManager)._M_t.
      super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
      .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl !=
      (PotentialInterfacesManager *)0x0)) {
    iVar2 = (this->potInterfacesSequence).super___atomic_base<int>._M_i;
    if (iVar2 == 2) {
      peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar3->_vptr_Core[0x13])(peVar3,(ulong)(uint)(this->fedID).fid,1);
      peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar3->_vptr_Core[0x5c])(&cmd,peVar3,(ulong)(uint)(this->fedID).fid);
      if (cmd.first._M_string_length != 0) goto LAB_00198a88;
      local_98.first._M_dataplus._M_p = &DAT_000000c8;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_98);
      peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar3->_vptr_Core[0x5c])(&local_98,peVar3,(ulong)(uint)(this->fedID).fid);
      while( true ) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&cmd,(type)&local_98);
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_98);
LAB_00198a88:
        if (cmd.first._M_string_length == 0) break;
        this_00 = (this->potManager)._M_t.
                  super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                  .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(&local_58,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&cmd);
        PotentialInterfacesManager::processCommand
                  (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_58);
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_58);
        peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar3->_vptr_Core[0x5c])(&local_98,peVar3,(ulong)(uint)(this->fedID).fid);
      }
      LOCK();
      (this->potInterfacesSequence).super___atomic_base<int>._M_i = 3;
      UNLOCK();
      CLI::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&cmd);
      return;
    }
    if (iVar2 == 0) {
      PotentialInterfacesManager::initialize
                ((this->potManager)._M_t.
                 super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                 .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl);
      peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar3->_vptr_Core[0x13])(peVar3,(ulong)(uint)(this->fedID).fid,1);
      LOCK();
      (this->potInterfacesSequence).super___atomic_base<int>._M_i = 2;
      UNLOCK();
      return;
    }
  }
  peVar3 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_Core[0x13])(peVar3,(ulong)(uint)(this->fedID).fid,1);
  return;
}

Assistant:

void Federate::enterInitializingModeIterative()
{
    auto cmode = currentMode.load();
    switch (cmode) {
        case Modes::STARTUP:
            try {
                if (hasPotentialInterfaces && potManager) {
                    switch (potInterfacesSequence.load()) {
                        case 0:
                            potManager->initialize();
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            potInterfacesSequence.store(2);
                            break;
                        case 2: {
                            // respond to query
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            // now check for commands
                            auto cmd = coreObject->getCommand(fedID);
                            if (cmd.first.empty()) {
                                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                                cmd = coreObject->getCommand(fedID);
                            }
                            while (!cmd.first.empty()) {
                                potManager->processCommand(std::move(cmd));
                                cmd = coreObject->getCommand(fedID);
                            }
                            potInterfacesSequence.store(3);
                        } break;
                        default:
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            break;
                    }
                } else {
                    coreObject->enterInitializingMode(fedID, IterationRequest::FORCE_ITERATION);
                }
            }
            catch (const HelicsException&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::PENDING_ITERATIVE_INIT:
            enterInitializingModeIterativeComplete();
            break;
        default:
            throw(InvalidFunctionCall("cannot call iterative initialization from current state"));
    }
}